

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O2

UnicodeString *
icu_63::ZoneMeta::formatCustomID
          (uint8_t hour,uint8_t min,uint8_t sec,UBool negative,UnicodeString *id)

{
  UnicodeString::setTo(id,L"GMT",-1);
  if (min != '\0' || hour != '\0') {
    UnicodeString::append(id,(ushort)(negative != '\0') * 2 + L'+');
    UnicodeString::append(id,(ushort)(byte)((byte)((ushort)((ushort)hour % 100) / 10) | 0x30));
    UnicodeString::append(id,(ushort)(byte)(hour % 10 | 0x30));
    UnicodeString::append(id,L':');
    UnicodeString::append(id,(ushort)(byte)((byte)((ushort)((ushort)min % 100) / 10) | 0x30));
    UnicodeString::append(id,(ushort)(byte)(min % 10 | 0x30));
    if (sec != '\0') {
      UnicodeString::append(id,L':');
      UnicodeString::append(id,(ushort)(byte)((byte)((ushort)((ushort)sec % 100) / 10) | 0x30));
      UnicodeString::append(id,(ushort)(byte)(sec % 10 | 0x30));
    }
  }
  return id;
}

Assistant:

UnicodeString&
ZoneMeta::formatCustomID(uint8_t hour, uint8_t min, uint8_t sec, UBool negative, UnicodeString& id) {
    // Create normalized time zone ID - GMT[+|-]HH:mm[:ss]
    id.setTo(gCustomTzPrefix, -1);
    if (hour != 0 || min != 0) {
        if (negative) {
          id.append((UChar)0x2D);    // '-'
        } else {
          id.append((UChar)0x2B);    // '+'
        }
        // Always use US-ASCII digits
        id.append((UChar)(0x30 + (hour%100)/10));
        id.append((UChar)(0x30 + (hour%10)));
        id.append((UChar)0x3A);    // ':'
        id.append((UChar)(0x30 + (min%100)/10));
        id.append((UChar)(0x30 + (min%10)));
        if (sec != 0) {
          id.append((UChar)0x3A);    // ':'
          id.append((UChar)(0x30 + (sec%100)/10));
          id.append((UChar)(0x30 + (sec%10)));
        }
    }
    return id;
}